

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O0

void __thiscall
adios2::core::Operator::Operator
          (Operator *this,string *typeString,OperatorType typeEnum,string *category,
          Params *parameters)

{
  string *in_RCX;
  undefined1 in_DL;
  string *in_RSI;
  undefined8 *in_RDI;
  Params *in_stack_00000068;
  
  *in_RDI = &PTR__Operator_0112c248;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  *(undefined1 *)(in_RDI + 5) = in_DL;
  std::__cxx11::string::string((string *)(in_RDI + 6),in_RCX);
  helper::LowerCaseParams(in_stack_00000068);
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  *(undefined1 *)(in_RDI + 0x12) = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  *(undefined1 *)(in_RDI + 0x15) = 0;
  return;
}

Assistant:

Operator::Operator(const std::string &typeString, const OperatorType typeEnum,
                   const std::string &category, const Params &parameters)
: m_TypeString(typeString), m_TypeEnum(typeEnum), m_Category(category),
  m_Parameters(helper::LowerCaseParams(parameters))
{
}